

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O1

wchar_t scp_finish_filerecv(void)

{
  FILE *stream;
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  sftp_packet *psVar4;
  char *pcVar5;
  sftp_request *req;
  void *vbuf;
  wchar_t len;
  void *local_40;
  int local_34;
  
  if (!using_sftp) {
    (*backend->vt->send)(backend,anon_var_dwarf_34748 + 10,1);
    wVar3 = response();
    return wVar3;
  }
  xfer_set_error(scp_sftp_xfer);
  do {
    _Var1 = xfer_done(scp_sftp_xfer);
    if (_Var1) {
      xfer_cleanup(scp_sftp_xfer);
      req = fxp_close_send(scp_sftp_filehandle);
      psVar4 = sftp_wait_for_reply(req);
      fxp_close_recv(psVar4,req);
      return L'\0';
    }
    psVar4 = sftp_recv();
    iVar2 = xfer_download_gotpkt(scp_sftp_xfer,psVar4);
    stream = _stderr;
    if (iVar2 < 1) {
      pcVar5 = fxp_error();
      tell_user(stream,"pscp: error while reading: %s",pcVar5);
      errs = errs + L'\x01';
    }
    else {
      _Var1 = xfer_download_data(scp_sftp_xfer,&local_40,&local_34);
      if (_Var1) {
        safefree(local_40);
      }
    }
  } while (0 < iVar2);
  return L'\xffffffff';
}

Assistant:

int scp_finish_filerecv(void)
{
    if (using_sftp) {
        struct sftp_packet *pktin;
        struct sftp_request *req;

        /*
         * Ensure that xfer_done() will work correctly, so we can
         * clean up any outstanding requests from the file
         * transfer.
         */
        xfer_set_error(scp_sftp_xfer);
        while (!xfer_done(scp_sftp_xfer)) {
            void *vbuf;
            int ret, len;

            pktin = sftp_recv();
            ret = xfer_download_gotpkt(scp_sftp_xfer, pktin);
            if (ret <= 0) {
                tell_user(stderr, "pscp: error while reading: %s", fxp_error());
                if (ret == INT_MIN)        /* pktin not even freed */
                    sfree(pktin);
                errs++;
                return -1;
            }
            if (xfer_download_data(scp_sftp_xfer, &vbuf, &len))
                sfree(vbuf);
        }
        xfer_cleanup(scp_sftp_xfer);

        req = fxp_close_send(scp_sftp_filehandle);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);
        return 0;
    } else {
        backend_send(backend, "", 1);
        return response();
    }
}